

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

action_t helics::getAction(InterfaceType type)

{
  InterfaceType type_local;
  undefined4 local_4;
  
  if (type == FILTER) {
    local_4 = cmd_add_filter;
  }
  else if (type == INPUT) {
    local_4 = cmd_add_subscriber;
  }
  else if (type == PUBLICATION) {
    local_4 = cmd_add_publisher;
  }
  else {
    local_4 = cmd_add_endpoint;
  }
  return local_4;
}

Assistant:

static action_message_def::action_t getAction(InterfaceType type)
{
    switch (type) {
        case InterfaceType::FILTER:
            return CMD_ADD_FILTER;
        case InterfaceType::PUBLICATION:
            return CMD_ADD_PUBLISHER;
        case InterfaceType::INPUT:
            return CMD_ADD_SUBSCRIBER;
        default:
            return CMD_ADD_ENDPOINT;
    }
}